

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O2

bool __thiscall xemmai::io::t_writer::f_resume(t_writer *this,t_io *a_library)

{
  t_queue<128UL> *ptVar1;
  bool bVar2;
  pthread_rwlock_t *__rwlock;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  anon_class_16_2_29d16f4a local_30;
  t_io *a_library_local;
  
  local_30.a_library = &a_library_local;
  ptVar1 = (this->super_t_sharable).super_t_owned.v_owner;
  local_30.this = this;
  a_library_local = a_library;
  if (ptVar1 == *(t_queue<128UL> **)(in_FS_OFFSET + -0x68)) {
    bVar2 = f_resume::anon_class_16_2_29d16f4a::operator()(&local_30);
  }
  else {
    if (ptVar1 != (t_queue<128UL> *)0x0) {
      a_message._M_str = L"owned by another thread.";
      a_message._M_len = 0x18;
      f_throw(a_message);
    }
    __rwlock = (pthread_rwlock_t *)
               t_lock_with_safe_region<std::shared_mutex>::f_lock(&(this->super_t_sharable).v_mutex)
    ;
    if ((this->super_t_sharable).super_t_owned.v_owner != (t_queue<128UL> *)0x0) {
      a_message_00._M_str = L"owned by another thread.";
      a_message_00._M_len = 0x18;
      f_throw(a_message_00);
    }
    bVar2 = f_resume::anon_class_16_2_29d16f4a::operator()(&local_30);
    pthread_rwlock_unlock(__rwlock);
  }
  return bVar2;
}

Assistant:

bool t_writer::f_resume(t_io* a_library)
{
	return f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		if (!v_stream) f_throw(L"already closed."sv);
		return f__resume(a_library);
	});
}